

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void duckdb_fmt::v6::internal::
     handle_int_type_spec<duckdb_fmt::v6::basic_format_specs<char>,duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>>
               (basic_format_specs<char> *specs,
               int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *handler)

{
  int iVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *in_stack_00000060;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff7c;
  int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [48];
  int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *in_stack_ffffffffffffffc0;
  
  if (*(char *)(in_RDI + 0x10) != '\0') {
    basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
    int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num(in_stack_00000060);
    return;
  }
  iVar1 = (int)*(char *)(in_RDI + 8);
  if (*(char *)(in_RDI + 8) == '\0') {
LAB_00f03ffb:
    basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
    int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_dec(in_stack_ffffffffffffffc0);
    return;
  }
  if (iVar1 == 0x42) {
LAB_00f0401f:
    basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
    int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_bin(in_stack_ffffffffffffffc0);
  }
  else {
    if (iVar1 == 0x4c) {
LAB_00f04043:
      basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
      int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num(in_stack_00000060);
      return;
    }
    if (iVar1 != 0x58) {
      if (iVar1 == 0x62) goto LAB_00f0401f;
      if (iVar1 == 100) goto LAB_00f03ffb;
      if ((iVar1 == 0x6c) || (iVar1 == 0x6e)) goto LAB_00f04043;
      if (iVar1 == 0x6f) {
        basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
        int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_oct
                  (in_stack_ffffffffffffffc0);
        return;
      }
      if (iVar1 != 0x78) {
        iVar2 = (int)*(char *)(in_RDI + 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,1,(char)iVar2,&local_71);
        std::operator+((char *)CONCAT44(iVar2,in_stack_ffffffffffffff68),in_RSI);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar2,in_stack_ffffffffffffff68),(char *)in_RSI);
        basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
        int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_error
                  (in_stack_ffffffffffffff80,(string *)CONCAT44(in_stack_ffffffffffffff7c,iVar1));
      }
    }
    basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
    int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_hex(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(const Spec& specs, Handler&& handler) {
  if (specs.thousands != '\0') {
    handler.on_num();
    return;
  }
  switch (specs.type) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'l':
  case 'L':
    handler.on_num();
    break;
  default:
    handler.on_error("Invalid type specifier \"" + std::string(1, specs.type) + "\" for formatting a value of type int");
  }
}